

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

string * __thiscall
Jupiter::Socket::resolveHostname_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,char *hostname,uint result)

{
  addrinfo *this_00;
  addrinfo *info;
  uint result_local;
  char *hostname_local;
  
  this_00 = getAddrInfo((char *)this,(char *)0x0);
  if (this_00 == (addrinfo *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    resolveHostname_abi_cxx11_
              (__return_storage_ptr__,(Socket *)this_00,(addrinfo *)((ulong)hostname & 0xffffffff),
               result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveHostname(const char *hostname, unsigned int result) { // static
	addrinfo *info = Jupiter::Socket::getAddrInfo(hostname, 0);
	if (info == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveHostname(info, result);
}